

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadIndices
          (CrateReader *this,
          vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> *indices)

{
  ulong uVar1;
  StreamReader *pSVar2;
  uint64_t uVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  size_t nbytes;
  size_t __n;
  uint64_t n;
  ostringstream ss_e;
  long *local_1d0;
  long local_1c0 [2];
  ulong local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar4 = StreamReader::read8(this->_sr,&local_1b0);
  if (bVar4) {
    if ((this->_config).maxNumIndices < local_1b0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadIndices",0xb);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0xda);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar8 = "Too many indices.";
      lVar7 = 0x11;
    }
    else {
      if (local_1b0 == 0) {
        return true;
      }
      uVar1 = local_1b0 * 4;
      uVar6 = this->_sr->length_;
      if (uVar1 < uVar6 || uVar1 - uVar6 == 0) {
        uVar6 = this->_memoryUsage + uVar1;
        this->_memoryUsage = uVar6;
        if ((this->_config).maxMemoryBudget < uVar6) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadIndices",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0xe9);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          pcVar8 = "Reached to max memory budget.";
        }
        else {
          ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::resize
                    (indices,local_1b0);
          pSVar2 = this->_sr;
          uVar3 = pSVar2->idx_;
          __n = pSVar2->length_ - uVar3;
          if (uVar3 + uVar1 <= pSVar2->length_) {
            __n = uVar1;
          }
          if (__n - 1 < uVar1) {
            memcpy((indices->
                   super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                   )._M_impl.super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,__n);
            pSVar2->idx_ = pSVar2->idx_ + __n;
          }
          else {
            __n = 0;
          }
          if (uVar1 - __n == 0) {
            return true;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadIndices",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0xef);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          pcVar8 = "Failed to read Indices array.";
        }
        lVar7 = 0x1d;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadIndices",0xb)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0xe6);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pcVar8 = "Indices data exceeds USDC size.";
        lVar7 = 0x1f;
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1d0);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base(local_138);
  }
  return false;
}

Assistant:

bool CrateReader::ReadIndices(std::vector<crate::Index> *indices) {
  uint64_t n;
  if (!_sr->read8(&n)) {
    return false;
  }

  if (n > _config.maxNumIndices) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many indices.");
  }

  if (n == 0) {
    return true;
  }

  DCOUT("ReadIndices: n = " << n);

  size_t datalen = size_t(n) * sizeof(crate::Index);

  if (datalen > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Indices data exceeds USDC size.");
  }

  CHECK_MEMORY_USAGE(datalen);

  indices->resize(size_t(n));

  if (datalen != _sr->read(datalen, datalen,
                          reinterpret_cast<uint8_t *>(indices->data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read Indices array.");
  }

  return true;
}